

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connection.cpp
# Opt level: O2

ssize_t __thiscall Connection::send(Connection *this,int __fd,void *__buf,size_t __n,int __flags)

{
  SharedPtr *client;
  element_type *peVar1;
  undefined1 uVar2;
  uint32_t size;
  undefined4 extraout_var;
  SocketClientBuffer *this_00;
  ssize_t sVar4;
  ulong uVar5;
  size_type __n_00;
  void *__buf_00;
  undefined7 uVar6;
  undefined4 in_register_00000034;
  Message *this_01;
  String header;
  String value;
  long lVar3;
  
  this_01 = (Message *)CONCAT44(in_register_00000034,__fd);
  peVar1 = (this->mSocketClient).super___shared_ptr<SocketClient,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  if ((peVar1 == (element_type *)0x0) || (peVar1->mFd == -1)) {
    if (this->mWarned == false) {
      this->mWarned = true;
      uVar5 = 0;
      warning("Trying to send message to unconnected client (%d)",(ulong)this_01->mMessageId);
    }
    else {
      uVar5 = 0;
    }
  }
  else {
    std::__shared_ptr<Connection,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<Connection,void>
              ((__shared_ptr<Connection,(__gnu_cxx::_Lock_policy)2> *)&header,
               (__weak_ptr<Connection,_(__gnu_cxx::_Lock_policy)2> *)this);
    value.mString._M_dataplus._M_p = (pointer)this_01;
    Signal<std::function<void(std::shared_ptr<Connection>,Message_const*)>>::operator()
              (&this->mAboutToSend,(shared_ptr<Connection> *)&header,(Message **)&value);
    client = &this->mSocketClient;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&header.mString._M_string_length);
    size = (*this_01->_vptr_Message[4])(this_01);
    lVar3 = CONCAT44(extraout_var,size);
    uVar6 = (undefined7)((ulong)this_01 >> 8);
    if ((lVar3 == -1) || ((this_01->mFlags & 2) != 0)) {
      header.mString._M_dataplus._M_p = (pointer)&header.mString.field_2;
      header.mString._M_string_length = 0;
      value.mString._M_dataplus._M_p = (pointer)&value.mString.field_2;
      value.mString._M_string_length = 0;
      header.mString.field_2._M_local_buf[0] = '\0';
      value.mString.field_2._M_local_buf[0] = '\0';
      Message::prepare(this_01,this->mVersion,&header,&value);
      this->mPendingWrite =
           this->mPendingWrite +
           (int)(void *)(value.mString._M_string_length + header.mString._M_string_length);
      if ((lVar3 != -1) &&
         (lVar3 != header.mString._M_string_length + value.mString._M_string_length + -4)) {
        __assert_fail("size == String::npos || size == (header.size() + value.size() - 4)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/Connection.cpp"
                      ,0xde,"bool Connection::send(const Message &)");
      }
      __n_00 = value.mString._M_string_length;
      sVar4 = SocketClient::write((client->
                                  super___shared_ptr<SocketClient,_(__gnu_cxx::_Lock_policy)2>).
                                  _M_ptr,(int)&header,
                                  (void *)(value.mString._M_string_length +
                                          header.mString._M_string_length),
                                  value.mString._M_string_length);
      if ((char)sVar4 == '\0') {
        uVar5 = 0;
      }
      else if (value.mString._M_string_length == 0) {
        uVar5 = CONCAT71(uVar6,1);
      }
      else {
        uVar5 = SocketClient::write((client->
                                    super___shared_ptr<SocketClient,_(__gnu_cxx::_Lock_policy)2>).
                                    _M_ptr,(int)&value,__buf_00,__n_00);
        uVar5 = uVar5 & 0xffffffff;
      }
      std::__cxx11::string::~string((string *)&value);
      std::__cxx11::string::~string((string *)&header);
    }
    else {
      this->mPendingWrite = this->mPendingWrite + size + 10;
      this_00 = (SocketClientBuffer *)operator_new(0x20);
      SocketClientBuffer::SocketClientBuffer(this_00,client);
      header.mString._M_dataplus._M_p = header.mString._M_dataplus._M_p & 0xffffffffffffff00;
      header.mString._M_string_length = (size_type)this_00;
      Message::encodeHeader(this_01,(Serializer *)&header,size,this->mVersion);
      (*this_01->_vptr_Message[2])(this_01,&header);
      uVar2 = header.mString._M_dataplus._M_p._0_1_;
      if (header.mString._M_string_length != 0) {
        (**(code **)(*(long *)header.mString._M_string_length + 8))();
      }
      uVar5 = CONCAT71(uVar6,uVar2) ^ 1;
    }
  }
  return uVar5 & 0xffffffff;
}

Assistant:

bool Connection::send(const Message &message)
{
    // ::error() << getpid() << "sending message" << static_cast<int>(message.messageId());
    if (!mSocketClient || !mSocketClient->isConnected()) {
        if (!mWarned) {
            mWarned = true;
            warning("Trying to send message to unconnected client (%d)", message.messageId());
        }
        return false;
    }

    mAboutToSend(shared_from_this(), &message);

#ifdef RCT_SERIALIZER_VERIFY_PRIMITIVE_SIZE
    const size_t size = String::npos;
#else
    const size_t size = message.encodedSize();
#endif

    if (size == String::npos || message.mFlags & Message::MessageCache) {
        String header, value;
        message.prepare(mVersion, header, value);
        mPendingWrite += header.size() + value.size();
        assert(size == String::npos || size == (header.size() + value.size() - 4));
        return (mSocketClient->write(header) && (value.isEmpty() || mSocketClient->write(value)));
    } else {
        mPendingWrite += (size + Message::HeaderExtra) + sizeof(int);
        Serializer serializer(std::unique_ptr<SocketClientBuffer>(new SocketClientBuffer(mSocketClient)));
        message.encodeHeader(serializer, size, mVersion);
        message.encode(serializer);
        return !serializer.hasError();
    }
}